

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.h
# Opt level: O3

void __thiscall DependentLoop::DependentLoop(DependentLoop *this,size_t numOfViews)

{
  pointer __s;
  pointer puVar1;
  
  memset(&this->branchFunctions,0,0xc0);
  (this->functionMask).
  super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->functionMask).
  super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functionMask).
  super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->next).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->next).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->next).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outView).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outView).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outView).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outView).m_num_bits = 0;
  (this->loopFactors).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loopFactors).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->loopFactors).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->loopFactors).m_num_bits = 0;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->outView,numOfViews + 1,false);
  __s = (this->outView).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->outView).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__s != puVar1) {
    memset(__s,0,(long)puVar1 - (long)__s & 0xfffffffffffffff8);
    return;
  }
  return;
}

Assistant:

DependentLoop(size_t numOfViews)
    {
        outView.resize(numOfViews + 1);
        outView.reset();
    }